

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestSplitTwice(void)

{
  ostream *poVar1;
  size_t sVar2;
  element_type *this;
  OutputBuffer buf1;
  char buffer [6];
  InputBuffer local_398;
  string msg1;
  char *local_368;
  char *local_360;
  const_string local_358;
  const_string local_348;
  istream is2;
  istream is;
  
  is2.super_istream._vptr_basic_istream = (_func_int **)anon_var_dwarf_8f9cc;
  is2.super_istream._M_gcount =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  is2.super_istream._16_8_ = 0x32f;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&is2);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  msg1._M_dataplus._M_p._0_1_ = 1;
  is.super_istream._M_gcount._0_1_ = 0;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001eac48;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_91017;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&msg1,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&msg1);
  makeString_abi_cxx11_(&msg1,0x1e);
  avro::OutputBuffer::OutputBuffer(&buf1,0);
  this = buf1.pimpl_.px;
  avro::detail::BufferImpl::writeTo
            (buf1.pimpl_.px,
             (data_type *)CONCAT71(msg1._M_dataplus._M_p._1_7_,msg1._M_dataplus._M_p._0_1_),
             msg1._M_string_length);
  local_348.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_348.m_end = "";
  local_358.m_begin = "";
  local_358.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_348,0x336,&local_358);
  is.super_istream._M_gcount._0_1_ = 0;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001ea848;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = (long)"\t" + 1;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_360 = "";
  is2.super_istream._vptr_basic_istream = (_func_int **)(buf1.pimpl_.px)->size_;
  local_398.pimpl_.px = (element_type *)msg1._M_string_length;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&is,&local_368,0x336,1,2,&is2,"buf1.size()",&local_398,"msg1.size()");
  avro::InputBuffer::InputBuffer((InputBuffer *)&is,&buf1);
  printBuffer((InputBuffer *)&is);
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream._M_gcount);
  avro::istream::istream(&is,&buf1);
  std::istream::readsome((char *)&is,(long)buffer);
  buffer[5] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,"buffer =");
  poVar1 = std::operator<<(poVar1,buffer);
  std::endl<char,std::char_traits<char>>(poVar1);
  sVar2 = std::istream::tellg();
  avro::OutputBuffer::discardData(&buf1,sVar2);
  avro::InputBuffer::InputBuffer((InputBuffer *)&is2,&buf1);
  printBuffer((InputBuffer *)&is2);
  boost::detail::shared_count::~shared_count((shared_count *)&is2.super_istream._M_gcount);
  avro::istream::istream(&is2,&buf1);
  std::istream::seekg(&is2,0xf,0);
  sVar2 = std::istream::tellg();
  avro::OutputBuffer::discardData(&buf1,sVar2);
  avro::InputBuffer::InputBuffer(&local_398,&buf1);
  printBuffer(&local_398);
  boost::detail::shared_count::~shared_count(&local_398.pimpl_.pn);
  avro::istream::~istream(&is2);
  avro::istream::~istream(&is);
  boost::detail::shared_count::~shared_count(&buf1.pimpl_.pn);
  std::__cxx11::string::~string((string *)&msg1);
  return;
}

Assistant:

void TestSplitTwice() 
{
    BOOST_TEST_MESSAGE( "TestSplitTwice");
    {
        const std::string msg1 = makeString(30);

        avro::OutputBuffer buf1;
        buf1.writeTo(msg1.c_str(), msg1.size());

        BOOST_CHECK_EQUAL(buf1.size(), msg1.size());

        printBuffer(buf1);

        avro::istream is(buf1);
        char buffer[6];
        is.readsome(buffer, 5);
        buffer[5] = 0;
        std::cout << "buffer =" << buffer << std::endl;
        
        buf1.discardData(static_cast<size_t>(is.tellg()));
        printBuffer(buf1);

        avro::istream is2(buf1);
        is2.seekg(15);

        buf1.discardData(static_cast<size_t>(is2.tellg()));
        printBuffer(buf1);
    }
}